

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O0

Am_Object am_call_create_placeholder
                    (Am_Object *proto,Am_Value *objs,Am_Object *create_cmd,
                    Am_Value_List *placeholder_list,Am_Value_List *part_chain,int *cnt,
                    Am_Slot_Key slot)

{
  Am_Value *value;
  Am_Wrapper *pAVar1;
  undefined6 in_stack_0000000a;
  undefined2 in_stack_00000010;
  Am_Assoc local_78 [3];
  Am_Value local_60;
  undefined1 local_49;
  undefined1 local_48 [8];
  Am_Placeholder_Create_Method method;
  Am_Value_List *part_chain_local;
  Am_Value_List *placeholder_list_local;
  Am_Object *create_cmd_local;
  Am_Value *objs_local;
  Am_Object *proto_local;
  Am_Object *placeholder;
  
  method.Call = (Am_Placeholder_Create_Method_Type *)cnt;
  value = Am_Object::Get((Am_Object *)objs,Am_PLACEHOLDER_CREATE_METHOD,0);
  Am_Placeholder_Create_Method::Am_Placeholder_Create_Method
            ((Am_Placeholder_Create_Method *)local_48,value);
  local_49 = 0;
  Am_Value::Am_Value(&local_60,(Am_Value *)create_cmd);
  (*(code *)method.from_wrapper)
            (proto,placeholder_list,&local_60,method.Call,CONCAT62(in_stack_0000000a,slot),
             in_stack_00000010);
  Am_Value::~Am_Value(&local_60);
  pAVar1 = Am_Object::operator_cast_to_Am_Wrapper_(proto);
  Am_Assoc::Am_Assoc(local_78,(Am_Value *)create_cmd,pAVar1);
  pAVar1 = Am_Assoc::operator_cast_to_Am_Wrapper_(local_78);
  Am_Value_List::Add(part_chain,pAVar1,Am_TAIL,true);
  Am_Assoc::~Am_Assoc(local_78);
  return (Am_Object)(Am_Object_Data *)proto;
}

Assistant:

Am_Object
am_call_create_placeholder(Am_Object proto, Am_Value &objs,
                           Am_Object &create_cmd,
                           Am_Value_List &placeholder_list,
                           Am_Value_List &part_chain, int &cnt,
                           Am_Slot_Key slot)
{
  Am_Placeholder_Create_Method method = proto.Get(Am_PLACEHOLDER_CREATE_METHOD);
  Am_Object placeholder = method.Call(create_cmd, objs, part_chain, cnt, slot);
  placeholder_list.Add(Am_Assoc(objs, placeholder));
  return placeholder;
}